

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O3

SPxId __thiscall soplex::SPxParMultPR<double>::selectEnter(SPxParMultPR<double> *this)

{
  DataKey *pDVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  pointer pSVar6;
  DataKey DVar7;
  SPxId SVar8;
  long lVar9;
  uint uVar10;
  double *pdVar11;
  SPxSolverBase<double> *pSVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int i;
  ulong uVar17;
  double dVar18;
  double local_48;
  
  pSVar12 = (this->super_SPxPricer<double>).thesolver;
  local_48 = -(this->super_SPxPricer<double>).thetolerance;
  if (pSVar12->thePricing == PARTIAL) {
    uVar2 = this->last;
    uVar17 = (ulong)this->used;
    if (0 < (long)uVar17) {
      uVar16 = uVar17 + 1;
      lVar9 = uVar17 << 4;
      do {
        pSVar6 = (this->pricSet).data.
                 super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar14 = 0xe8;
        if (*(int *)((long)&pSVar6[-1].id.super_DataKey + lVar9) < 1) {
          lVar14 = 0x20;
        }
        iVar5 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                          ((ClassSet<soplex::SVSetBase<double>::DLPSV> *)
                           ((long)&(((this->super_SPxPricer<double>).thesolver)->
                                   super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                   super_SVSetBase<double>.
                                   super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray +
                           lVar14),(DataKey *)((long)&pSVar6[-1].id.super_DataKey + lVar9));
        pSVar12 = (this->super_SPxPricer<double>).thesolver;
        pSVar6 = (this->pricSet).data.
                 super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pSVar12->theRep * *(int *)((long)&pSVar6[-1].id.super_DataKey + lVar9) < 1) {
          dVar18 = (pSVar12->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar5];
        }
        else {
          SPxSolverBase<double>::computePvec(pSVar12,iVar5);
          dVar18 = SPxSolverBase<double>::computeTest
                             ((this->super_SPxPricer<double>).thesolver,iVar5);
          pSVar6 = (this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        *(double *)((long)&pSVar6[-1].test + lVar9) = dVar18;
        if (local_48 <= dVar18) {
          lVar14 = (long)this->used + -1;
          this->used = (int)lVar14;
          DVar7 = (DataKey)pSVar6[lVar14].test;
          pDVar1 = (DataKey *)((long)&pSVar6[-1].id.super_DataKey + lVar9);
          *pDVar1 = pSVar6[lVar14].id.super_DataKey;
          pDVar1[1] = DVar7;
        }
        uVar16 = uVar16 - 1;
        lVar9 = lVar9 + -0x10;
      } while (1 < uVar16);
      uVar17 = (ulong)(uint)this->used;
    }
    pSVar6 = (this->pricSet).data.
             super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (long)(this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6;
    while (iVar5 = (int)uVar17, (int)(uVar16 >> 4) - iVar5 < this->partialSize) {
      if (iVar5 < 2) {
        lVar9 = 0;
      }
      else {
        pdVar11 = &pSVar6[1].test;
        uVar15 = 0;
        uVar16 = 1;
        do {
          uVar4 = uVar16 & 0xffffffff;
          if (*pdVar11 < pSVar6[(int)uVar15].test || *pdVar11 == pSVar6[(int)uVar15].test) {
            uVar4 = uVar15;
          }
          uVar15 = uVar4;
          uVar16 = uVar16 + 1;
          pdVar11 = pdVar11 + 2;
        } while ((uVar17 & 0xffffffff) != uVar16);
        lVar9 = (long)(int)uVar15;
      }
      this->used = iVar5 + -1;
      dVar18 = pSVar6[(long)iVar5 + -1].test;
      pSVar6[lVar9].id.super_DataKey = pSVar6[(long)iVar5 + -1].id.super_DataKey;
      pSVar6[lVar9].test = dVar18;
      pSVar6 = (this->pricSet).data.
               super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = (ulong)(uint)this->used;
      uVar16 = (long)(this->pricSet).data.
                     super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6;
    }
    iVar5 = this->multiParts;
    uVar10 = this->last;
    do {
      uVar10 = (int)(uVar10 + 1) % iVar5;
      this->last = uVar10;
      pSVar12 = (this->super_SPxPricer<double>).thesolver;
      uVar13 = ~uVar10;
      i = (pSVar12->thevectors->set).thenum + uVar13;
      if (-1 < i) {
        do {
          SPxSolverBase<double>::computePvec((this->super_SPxPricer<double>).thesolver,i);
          dVar18 = SPxSolverBase<double>::computeTest((this->super_SPxPricer<double>).thesolver,i);
          if (dVar18 < local_48) {
            SVar8 = SPxSolverBase<double>::id((this->super_SPxPricer<double>).thesolver,i);
            (this->pricSet).data.
            super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
            ._M_impl.super__Vector_impl_data._M_start[this->used].id.super_DataKey =
                 SVar8.super_DataKey;
            iVar5 = this->used;
            (this->pricSet).data.
            super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar5].test = dVar18;
            this->used = iVar5 + 1;
          }
          iVar5 = this->multiParts;
          i = i - iVar5;
        } while (-1 < i);
        pSVar12 = (this->super_SPxPricer<double>).thesolver;
        uVar10 = this->last;
        uVar13 = ~uVar10;
      }
      uVar13 = uVar13 + (pSVar12->thecovectors->set).thenum;
      if (-1 < (int)uVar13) {
        do {
          pSVar12 = (this->super_SPxPricer<double>).thesolver;
          dVar18 = (pSVar12->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar13];
          if (dVar18 < local_48) {
            SVar8 = SPxSolverBase<double>::coId(pSVar12,uVar13);
            (this->pricSet).data.
            super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
            ._M_impl.super__Vector_impl_data._M_start[this->used].id.super_DataKey =
                 SVar8.super_DataKey;
            iVar5 = this->used;
            (this->pricSet).data.
            super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar5].test = dVar18;
            this->used = iVar5 + 1;
            iVar5 = this->multiParts;
          }
          uVar13 = uVar13 - iVar5;
        } while (-1 < (int)uVar13);
        uVar10 = this->last;
      }
      uVar13 = this->used;
    } while (((int)uVar13 < this->min) && (uVar10 != uVar2));
    if ((int)uVar13 < 1) {
      DVar7.info = 0;
      DVar7.idx = 0;
      uVar16 = 0xffffffff;
    }
    else {
      iVar5 = this->partialSize;
      if ((int)(uVar13 + 1) < this->partialSize) {
        iVar5 = uVar13 + 1;
      }
      this->min = iVar5;
      uVar17 = 0;
      pSVar6 = (this->pricSet).data.
               super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)uVar13 != 1) {
        pdVar11 = &pSVar6[1].test;
        uVar16 = 1;
        do {
          uVar15 = uVar16 & 0xffffffff;
          if (pSVar6[(int)uVar17].test < *pdVar11 || pSVar6[(int)uVar17].test == *pdVar11) {
            uVar15 = uVar17;
          }
          uVar17 = uVar15;
          uVar16 = uVar16 + 1;
          pdVar11 = pdVar11 + 2;
        } while (uVar13 != uVar16);
        uVar17 = (ulong)(int)uVar17;
      }
      DVar7 = pSVar6[uVar17].id.super_DataKey;
      uVar16 = (ulong)DVar7 >> 0x20;
    }
  }
  else {
    uVar17 = (ulong)(pSVar12->thecovectors->set).thenum;
    if ((long)uVar17 < 1) {
      DVar7.info = 0;
      DVar7.idx = 0;
      uVar16 = 0xffffffff;
    }
    else {
      uVar16 = 0xffffffff;
      DVar7.info = 0;
      DVar7.idx = 0;
      do {
        pdVar11 = (pSVar12->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start + (uVar17 - 1);
        if (*pdVar11 <= local_48 && local_48 != *pdVar11) {
          DVar7 = (DataKey)SPxSolverBase<double>::coId(pSVar12,(int)uVar17 + -1);
          uVar16 = (ulong)DVar7 >> 0x20;
          pSVar12 = (this->super_SPxPricer<double>).thesolver;
          local_48 = (pSVar12->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar17 - 1];
        }
        bVar3 = 1 < uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar3);
    }
    uVar17 = (ulong)(pSVar12->thevectors->set).thenum;
    if (0 < (long)uVar17) {
      do {
        pdVar11 = (pSVar12->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start + (uVar17 - 1);
        if (*pdVar11 <= local_48 && local_48 != *pdVar11) {
          DVar7 = (DataKey)SPxSolverBase<double>::id(pSVar12,(int)uVar17 + -1);
          uVar16 = (ulong)DVar7 >> 0x20;
          pSVar12 = (this->super_SPxPricer<double>).thesolver;
          local_48 = (pSVar12->theTest).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar17 - 1];
        }
        bVar3 = 1 < uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar3);
    }
  }
  return (SPxId)((ulong)DVar7 & 0xffffffff | uVar16 << 0x20);
}

Assistant:

SPxId SPxParMultPR<R>::selectEnter()
{
   SPxId id;
   R x;
   int i;
   int best = -1;
   //    const SPxBasisBase<R>::Desc& ds   = this->thesolver->basis().desc();

   assert(this->thesolver != nullptr);
   int lastlast = -1;

   if(this->thesolver->pricing() == SPxSolverBase<R>::PARTIAL)
   {
      R val;
      R tol = -this->thetolerance;
      lastlast = last;

      for(i = used - 1; i >= 0; --i)
      {
         int n = this->thesolver->number(pricSet[i].id);

         if(this->thesolver->isId(pricSet[i].id))
         {
            this->thesolver->computePvec(n);
            pricSet[i].test = val = this->thesolver->computeTest(n);
         }
         else
            pricSet[i].test = val = this->thesolver->coTest()[n];

         if(val >= tol)
            pricSet[i] = pricSet[--used];
      }

      while(pricSet.size() - used < partialSize)
      {
         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test > pricSet[best].test)
               best = i;
         }

         pricSet[best] = pricSet[--used];
      }

      do
      {
         last = (last + 1) % multiParts;

         for(i = this->thesolver->coDim() - last - 1;
               i >= 0; i -= multiParts)
         {
            this->thesolver->computePvec(i);
            x = this->thesolver->computeTest(i);

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->id(i);
               pricSet[used].test = x;
               used++;
            }
         }

         for(i = this->thesolver->dim() - last - 1;
               i >= 0; i -= multiParts)
         {
            x = this->thesolver->coTest()[i];

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->coId(i);
               pricSet[used].test = x;
               used++;
            }
         }

         assert(used < pricSet.size());
      }
      while(used < min && last != lastlast);

      if(used > 0)
      {
         min = (used + 1);

         if(min < 1)
            min = 1;

         if(min > partialSize)
            min = partialSize;

         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test < pricSet[best].test)
               best = i;
         }

         id = pricSet[best].id;
      }

      return id;
   }

   else
   {
      assert(this->thesolver->pricing() == SPxSolverBase<R>::FULL);
      R bestx = -this->thetolerance;

      for(i = this->thesolver->dim() - 1; i >= 0; --i)
      {
         x = this->thesolver->coTest()[i];

         // x *= EQ_PREF * (1 + (ds.coStatus(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.coStatus(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->coId(i);
            bestx = this->thesolver->coTest()[i];
         }
      }

      for(i = this->thesolver->coDim() - 1; i >= 0; --i)
      {
         x = this->thesolver->test()[i];

         // x *= EQ_PREF * (1 + (ds.status(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.status(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->id(i);
            bestx = this->thesolver->test()[i];
         }
      }

      return id;
   }
}